

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
::lock(shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
       *this)

{
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *in_RSI;
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *in_RDI;
  pointer in_stack_ffffffffffffffa8;
  lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  *val;
  unique_lock<std::shared_mutex> local_20 [2];
  
  if ((in_RSI[5].m_handle_lock._M_owns & 1U) == 0) {
    val = in_RDI;
    std::unique_lock<std::shared_mutex>::unique_lock(local_20);
    lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
    ::lock_handle(in_RSI,(pointer)val,(unique_lock<std::shared_mutex> *)in_RDI);
    std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)in_RDI);
  }
  else {
    lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
    ::lock_handle(in_RDI,in_stack_ffffffffffffffa8,(shared_mutex *)0x2e21ea);
    val = in_RDI;
  }
  return val;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}